

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

void simple_interface_exec(_func_void_void_ptr *idle_proc,void *idle_data)

{
  FILE *__stream;
  bool bVar1;
  char *pcVar2;
  int local_54;
  duration<long,_std::ratio<1L,_1000L>_> local_50;
  char *local_48;
  double vol;
  uint channel;
  bool logarithmic;
  char *names [2];
  double volumes [2];
  void *idle_data_local;
  _func_void_void_ptr *idle_proc_local;
  
  while( true ) {
    bVar1 = interface_interrupted();
    __stream = _stderr;
    if (bVar1) break;
    if (idle_proc != (_func_void_void_ptr *)0x0) {
      (*idle_proc)(idle_data);
    }
    fprintf(_stderr,"\x1b[2K");
    names[1] = (char *)lvcurrent[0];
    _channel = "Left";
    names[0] = "Right";
    vol._7_1_ = 0;
    for (vol._0_4_ = 0; vol._0_4_ < 2; vol._0_4_ = vol._0_4_ + 1) {
      local_48 = names[(ulong)vol._0_4_ + 1];
      fprintf(_stderr," %c ",(ulong)(uint)(int)**(char **)(&channel + (ulong)vol._0_4_ * 2));
      print_volume_bar((FILE *)_stderr,0x1e,(double)local_48);
      pcVar2 = "     ";
      if (1.0 < (double)local_48) {
        pcVar2 = " \x1b[7mCLIP\x1b[0m";
      }
      fprintf(_stderr,pcVar2);
    }
    fprintf(_stderr,"\r");
    fflush(_stderr);
    local_54 = 0x32;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000l>> *)&local_50,&local_54);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_50);
  }
  pcVar2 = _("Interrupted.");
  fprintf(__stream,"%s\n",pcVar2);
  return;
}

Assistant:

static void simple_interface_exec(void(*idle_proc)(void *), void *idle_data)
{
    while (1) {
        if (interface_interrupted()) {
            fprintf(stderr, "%s\n", _("Interrupted."));
            break;
        }

        if (idle_proc)
            idle_proc(idle_data);

        fprintf(stderr, "\033[2K");
        double volumes[2] = {lvcurrent[0], lvcurrent[1]};
        const char *names[2] = {"Left", "Right"};

        // enables logarithmic view for perceptual volume, otherwise linear.
        //  (better use linear to watch output for clipping)
        const bool logarithmic = false;

        for (unsigned channel = 0; channel < 2; ++channel) {
            double vol = volumes[channel];
            if (logarithmic && vol > 0) {
                double db = 20 * log10(vol);
                const double dbmin = -60.0;
                vol = (db - dbmin) / (0 - dbmin);
            }
            fprintf(stderr, " %c ", names[channel][0]);
            print_volume_bar(stderr, 30, vol);
            fprintf(stderr, (vol > 1.0) ? " \033[7mCLIP\033[0m" : "     ");
        }

        fprintf(stderr, "\r");
        fflush(stderr);

#ifdef ADLJACK_GTK3
        gtk_main_iteration_do(false);
#endif

        std::this_thread::sleep_for(stc::milliseconds(50));
    }
}